

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void anon_unknown.dwarf_5b8e::fs_get_file_info
               (void *context,char *path,llb_fs_file_info_t *file_info_out)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat buf;
  llb_fs_file_info_t *file_info_out_local;
  char *path_local;
  void *context_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)file_info_out;
  printf(" -- stat: %s\n",path);
  fflush(_stdout);
  iVar1 = stat(path,(stat *)local_b0);
  if (iVar1 == 0) {
    *(undefined1 (*) [8])buf.__glibc_reserved[2] = local_b0;
    *(__dev_t *)(buf.__glibc_reserved[2] + 8) = buf.st_dev;
    *(__dev_t *)(buf.__glibc_reserved[2] + 0x18) = buf.st_rdev;
    *(__syscall_slong_t *)(buf.__glibc_reserved[2] + 0x20) = buf.st_atim.tv_nsec;
    *(undefined8 *)(buf.__glibc_reserved[2] + 0x28) = 0;
  }
  else {
    memset((void *)buf.__glibc_reserved[2],0,0x30);
  }
  return;
}

Assistant:

static void fs_get_file_info(void* context, const char* path,
                             llb_fs_file_info_t* file_info_out) {
  printf(" -- stat: %s\n", path);
  fflush(stdout);
  
  struct stat buf;
  if (stat(path, &buf) != 0) {
    memset(file_info_out, 0, sizeof(*file_info_out));
    return;
  }
  
  file_info_out->device = buf.st_dev;
  file_info_out->inode = buf.st_ino;
  file_info_out->size = buf.st_size;
  file_info_out->mod_time.seconds = buf.st_mtime;
  file_info_out->mod_time.nanoseconds = 0;
}